

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::XThreadPaf::destroy(XThreadPaf *this)

{
  Mutex *this_00;
  bool bVar1;
  XThreadPaf *local_58;
  undefined **local_50;
  XThreadPaf **local_48;
  Mutex *local_40;
  undefined1 local_38;
  
  if (this->state != DISPATCHED) {
    LOCK();
    bVar1 = this->state == WAITING;
    if (bVar1) {
      this->state = CANCELED;
    }
    UNLOCK();
    if (!bVar1) {
      this_00 = (Mutex *)(((this->executor).ptr)->impl).ptr;
      local_50 = (undefined **)((ulong)local_50 & 0xffffffffffffff00);
      local_58 = this;
      Mutex::lock(this_00,0,&local_50);
      local_40 = this_00 + 1;
      local_50 = &PTR_check_006dd898;
      local_38 = 0;
      local_48 = &local_58;
      Mutex::wait(this_00,&local_50);
      if (this->state == FULFILLED) {
        List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::remove
                  ((List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link> *)&this_00[5].waitersHead,
                   (char *)this);
      }
      Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
      (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[6])(this);
    }
    return;
  }
  (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[6])(this);
  return;
}

Assistant:

void XThreadPaf::destroy() {
  auto oldState = WAITING;

  if (__atomic_load_n(&state, __ATOMIC_ACQUIRE) == DISPATCHED) {
    // Common case: Promise was fully fulfilled and dispatched, no need for locking.
    delete this;
  } else if (__atomic_compare_exchange_n(&state, &oldState, CANCELED, false,
                                         __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
    // State transitioned from WAITING to CANCELED, so now it's the fulfiller's job to destroy the
    // object.
  } else {
    // Whoops, another thread is already in the process of fulfilling this promise. We'll have to
    // wait for it to finish and transition the state to FULFILLED.
    executor->impl->state.when([&](auto&) {
      return state == FULFILLED || state == DISPATCHED;
    }, [&](Executor::Impl::State& exState) {
      if (state == FULFILLED) {
        // The object is on the queue but was not yet dispatched. Remove it.
        exState.fulfilled.remove(*this);
      }
    });

    // It's ours now, delete it.
    delete this;
  }
}